

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O0

Point<double> * __thiscall
Parfait::Facet::GetClosestPoint
          (Point<double> *__return_storage_ptr__,Facet *this,Point<double> safe)

{
  const_reference pvVar1;
  const_reference pvVar2;
  double dVar3;
  double dVar4;
  Point<double> *point;
  Point<double> local_120;
  Point<double> local_108;
  Point<double> local_f0;
  Point<double> local_d8;
  double local_c0;
  double denom;
  double numer;
  double tmpoints;
  double tmp0;
  double invDet;
  double t;
  double s;
  double det;
  double b1;
  double b0;
  double a11;
  double a01;
  double a00;
  Point<double> edge1;
  Point<double> edge0;
  Point<double> diff;
  Facet *this_local;
  
  (__return_storage_ptr__->pos)._M_elems[0] = safe.pos._M_elems[0];
  (__return_storage_ptr__->pos)._M_elems[1] = safe.pos._M_elems[1];
  (__return_storage_ptr__->pos)._M_elems[2] = safe.pos._M_elems[2];
  pvVar1 = std::array<Parfait::Point<double>,_3UL>::operator[](&this->points,0);
  Point<double>::operator-((Point<double> *)(edge0.pos._M_elems + 2),pvVar1,__return_storage_ptr__);
  pvVar1 = std::array<Parfait::Point<double>,_3UL>::operator[](&this->points,1);
  pvVar2 = std::array<Parfait::Point<double>,_3UL>::operator[](&this->points,0);
  Point<double>::operator-((Point<double> *)(edge1.pos._M_elems + 2),pvVar1,pvVar2);
  pvVar1 = std::array<Parfait::Point<double>,_3UL>::operator[](&this->points,2);
  pvVar2 = std::array<Parfait::Point<double>,_3UL>::operator[](&this->points,0);
  Point<double>::operator-((Point<double> *)&a00,pvVar1,pvVar2);
  a01 = LocalMacroCrap::squaredMagnitude((Point<double> *)(edge1.pos._M_elems + 2));
  a11 = Point<double>::dot((Point<double> *)(edge1.pos._M_elems + 2),(Point<double> *)&a00);
  b0 = LocalMacroCrap::squaredMagnitude((Point<double> *)&a00);
  b1 = Point<double>::dot((Point<double> *)(edge0.pos._M_elems + 2),
                          (Point<double> *)(edge1.pos._M_elems + 2));
  det = Point<double>::dot((Point<double> *)(edge0.pos._M_elems + 2),(Point<double> *)&a00);
  s = ABS(a01 * b0 + -(a11 * a11));
  dVar3 = a11 * det + -(b0 * b1);
  dVar4 = a11 * b1 + -(a01 * det);
  if (s < dVar3 + dVar4) {
    if (0.0 <= dVar3) {
      if (0.0 <= dVar4) {
        denom = ((b0 + det) - a11) - b1;
        if (0.0 < denom) {
          local_c0 = (a01 - (a11 + a11)) + b0;
          if (denom < local_c0) {
            t = denom / local_c0;
            invDet = 1.0 - t;
          }
          else {
            t = 1.0;
            invDet = 0.0;
          }
        }
        else {
          t = 0.0;
          invDet = 1.0;
        }
      }
      else {
        tmpoints = a11 + det;
        numer = a01 + b1;
        if (numer <= tmpoints) {
          invDet = 0.0;
          if (0.0 < numer) {
            if (b1 < 0.0) {
              t = -b1 / a01;
            }
            else {
              t = 0.0;
            }
          }
          else {
            t = 1.0;
          }
        }
        else {
          denom = numer - tmpoints;
          local_c0 = (a01 - (a11 + a11)) + b0;
          if (denom < local_c0) {
            invDet = denom / local_c0;
            t = 1.0 - invDet;
          }
          else {
            invDet = 1.0;
            t = 0.0;
          }
        }
      }
    }
    else {
      tmpoints = a11 + b1;
      numer = b0 + det;
      if (numer <= tmpoints) {
        t = 0.0;
        if (0.0 < numer) {
          if (det < 0.0) {
            invDet = -det / b0;
          }
          else {
            invDet = 0.0;
          }
        }
        else {
          invDet = 1.0;
        }
      }
      else {
        denom = numer - tmpoints;
        local_c0 = (a01 - (a11 + a11)) + b0;
        if (denom < local_c0) {
          t = denom / local_c0;
          invDet = 1.0 - t;
        }
        else {
          t = 1.0;
          invDet = 0.0;
        }
      }
    }
  }
  else if (0.0 <= dVar3) {
    if (0.0 <= dVar4) {
      tmp0 = 1.0 / s;
      t = tmp0 * dVar3;
      invDet = tmp0 * dVar4;
    }
    else {
      invDet = 0.0;
      if (b1 < 0.0) {
        if (-b1 < a01) {
          t = -b1 / a01;
        }
        else {
          t = 1.0;
        }
      }
      else {
        t = 0.0;
      }
    }
  }
  else if (0.0 <= dVar4) {
    t = 0.0;
    if (det < 0.0) {
      if (-det < b0) {
        invDet = -det / b0;
      }
      else {
        invDet = 1.0;
      }
    }
    else {
      invDet = 0.0;
    }
  }
  else if (0.0 <= b1) {
    t = 0.0;
    if (det < 0.0) {
      if (-det < b0) {
        invDet = -det / b0;
      }
      else {
        invDet = 1.0;
      }
    }
    else {
      invDet = 0.0;
    }
  }
  else {
    invDet = 0.0;
    if (-b1 < a01) {
      t = -b1 / a01;
    }
    else {
      t = 1.0;
    }
  }
  pvVar1 = std::array<Parfait::Point<double>,_3UL>::operator[](&this->points,0);
  operator*(&local_108,t,(Point<double> *)(edge1.pos._M_elems + 2));
  Point<double>::operator+(&local_f0,pvVar1,&local_108);
  operator*(&local_120,invDet,(Point<double> *)&a00);
  Point<double>::operator+(&local_d8,&local_f0,&local_120);
  (__return_storage_ptr__->pos)._M_elems[0] = local_d8.pos._M_elems[0];
  (__return_storage_ptr__->pos)._M_elems[1] = local_d8.pos._M_elems[1];
  (__return_storage_ptr__->pos)._M_elems[2] = local_d8.pos._M_elems[2];
  return __return_storage_ptr__;
}

Assistant:

inline Parfait::Point<double> Parfait::Facet::GetClosestPoint(Point<double> safe) const {

    Point<double> point = safe;
    Point<double> diff = points[0] - point;
    const Point<double> edge0 = points[1] - points[0];
    const Point<double> edge1 = points[2] - points[0];

    double a00 = LocalMacroCrap::squaredMagnitude(edge0);
    double a01 = Point<double>::dot(edge0, edge1);
    double a11 = LocalMacroCrap::squaredMagnitude(edge1);
    double b0 = Point<double>::dot(diff, edge0);
    double b1 = Point<double>::dot(diff, edge1);
    double det = fabs(a00 * a11 - a01 * a01);
    double s = a01 * b1 - a11 * b0;
    double t = a01 * b0 - a00 * b1;
    /*
      \     |
       \reg2|
        \   |
         \  |
          \ |
           \|
            *points[1]
            |\
            | \
      reg3  |  \ reg1
            |   \
            |reg0\
            |     \
            |      \ points[0]
     -------*-------*------->s
            |P0      \
      reg4  | reg5    \ reg6
    */
    if (s + t <= det) {
        if (s < (double) 0) {
            if (t < (double) 0) {
                if (b0 < (double) 0) {
                    t = (double) 0;
                    if (-b0 >= a00)
                        s = (double) 1;
                    else
                        s = -b0 / a00;
                } else {
                    s = (double) 0;
                    if (b1 >= (double) 0)
                        t = (double) 0;
                    else if (-b1 >= a11)
                        t = (double) 1;
                    else
                        t = -b1 / a11;
                }
            } else {
                s = (double) 0;
                if (b1 >= (double) 0)
                    t = (double) 0;
                else if (-b1 >= a11)
                    t = (double) 1;
                else
                    t = -b1 / a11;
            }
        } else if (t < (double) 0) {
            t = (double) 0;
            if (b0 >= (double) 0)
                s = (double) 0;
            else if (-b0 >= a00)
                s = (double) 1;
            else
                s = -b0 / a00;
        } else {
            double invDet = ((double) 1) / det;
            s *= invDet;
            t *= invDet;
        }
    } else {
        double tmp0, tmpoints, numer, denom;

        if (s < (double) 0) {
            tmp0 = a01 + b0;
            tmpoints = a11 + b1;
            if (tmpoints > tmp0) {
                numer = tmpoints - tmp0;
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    s = (double) 1;
                    t = (double) 0;
                } else {
                    s = numer / denom;
                    t = (double) 1 - s;
                }
            } else {
                s = (double) 0;
                if (tmpoints <= (double) 0)
                    t = (double) 1;
                else if (b1 >= (double) 0)
                    t = (double) 0;
                else
                    t = -b1 / a11;
            }
        } else if (t < (double) 0) {
            tmp0 = a01 + b1;
            tmpoints = a00 + b0;
            if (tmpoints > tmp0) {
                numer = tmpoints - tmp0;
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    t = (double) 1;
                    s = (double) 0;
                } else {
                    t = numer / denom;
                    s = (double) 1 - t;
                }
            } else {
                t = (double) 0;
                if (tmpoints <= (double) 0)
                    s = (double) 1;
                else if (b0 >= (double) 0)
                    s = (double) 0;
                else
                    s = -b0 / a00;
            }
        } else {
            numer = a11 + b1 - a01 - b0;
            if (numer <= (double) 0) {
                s = (double) 0;
                t = (double) 1;
            } else {
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    s = (double) 1;
                    t = (double) 0;
                } else {
                    s = numer / denom;
                    t = (double) 1 - s;
                }
            }
        }
    }

    point = points[0] + s * edge0 + t * edge1;
    return point;
}